

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des_cbc_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  LR lr;
  LR LVar1;
  LR plaintext;
  LR cipher_out;
  LR ciphertext;
  uint8_t *data;
  des_cbc_ctx *ctx;
  int len_local;
  void *vdata_local;
  ssh_cipher *ciph_local;
  
  ciphertext = (LR)vdata;
  for (ctx._4_4_ = len; 0 < ctx._4_4_; ctx._4_4_ = ctx._4_4_ + -8) {
    lr = des_load_lr((void *)ciphertext);
    LVar1 = des_full_cipher(lr,(des_keysched *)(ciph + -0x11),0xf,0xffffffffffffffff);
    LVar1 = des_xor_lr(LVar1,*(LR *)(ciph + -1));
    des_store_lr((void *)ciphertext,LVar1);
    *(LR *)(ciph + -1) = lr;
    ciphertext = (LR)((long)ciphertext + 8);
  }
  return;
}

Assistant:

static void des_cbc_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des_cbc_ctx *ctx = container_of(ciph, struct des_cbc_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR ciphertext = des_load_lr(data);
        LR cipher_out = des_full_cipher(ciphertext, &ctx->sched, DECIPHER);
        LR plaintext = des_xor_lr(cipher_out, ctx->iv);
        des_store_lr(data, plaintext);
        ctx->iv = ciphertext;
    }
}